

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O2

JavascriptPromise * __thiscall
JsUtil::Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer>::Pop
          (Stack<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_DefaultComparer> *this)

{
  Type pJVar1;
  Type *ppJVar2;
  
  ppJVar2 = List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Item(&this->list,
                   (this->list).
                   super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>
                   .count + -1);
  pJVar1 = *ppJVar2;
  List<Js::JavascriptPromise_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::RemoveAt(&this->list,
             (this->list).
             super_ReadOnlyList<Js::JavascriptPromise_*,_Memory::HeapAllocator,_DefaultComparer>.
             count + -1);
  return pJVar1;
}

Assistant:

T Pop()
        {
            T item = list.Item(list.Count() - 1);
            list.RemoveAt(list.Count() - 1);
            return item;
        }